

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::setIPV4Address(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                        bool exception)

{
  bool bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  uint uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  ulong uVar7;
  invalid_argument *piVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  GenericException *ex;
  int i;
  string elem;
  stringstream in;
  int64_t ip;
  IInteger *val;
  INode *node;
  bool ret;
  size_t *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  long *local_388;
  allocator local_341;
  string local_340 [32];
  string local_320 [38];
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [38];
  undefined1 local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [36];
  int local_26c;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  stringstream local_220 [392];
  ulong local_98;
  long *local_90;
  gcstring local_78 [80];
  long local_28;
  byte local_1a;
  byte local_19;
  char *local_18;
  char *local_10;
  long lVar6;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar5 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1296bf);
  GenICam_3_4::gcstring::gcstring(local_78,local_10);
  iVar2 = (*(peVar5->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar5,local_78);
  lVar6 = CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring(local_78);
  local_28 = lVar6;
  if (lVar6 == 0) {
    if ((local_19 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"Feature not found: ",&local_341);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffc20);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_320);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsWritable((IBase *)in_stack_fffffffffffffc20);
    if (bVar1) {
      if (local_28 == 0) {
        local_388 = (long *)0x0;
      }
      else {
        local_388 = (long *)__dynamic_cast(local_28,&GenApi_3_4::INode::typeinfo,
                                           &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      }
      local_90 = local_388;
      if (local_388 == (long *)0x0) {
        if ((local_19 & 1) != 0) {
          local_2b2 = 1;
          piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b0,"Feature not integer: ",&local_2b1);
          std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
          std::invalid_argument::invalid_argument(piVar8,local_290);
          local_2b2 = 0;
          __cxa_throw(piVar8,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        local_98 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,local_18,&local_241);
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_220,local_240,_Var3);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        std::__cxx11::string::string(local_268);
        for (local_26c = 0; local_26c < 4; local_26c = local_26c + 1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_220,local_268,'.');
          uVar7 = local_98 << 8;
          uVar4 = std::__cxx11::stoi(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,0);
          local_98 = uVar7 | (long)(int)(uVar4 & 0xff);
        }
        (**(code **)(*local_90 + 0x38))(local_90,local_98,1);
        local_1a = 1;
        std::__cxx11::string::~string(local_268);
        std::__cxx11::stringstream::~stringstream(local_220);
      }
    }
    else if ((local_19 & 1) != 0) {
      local_2fa = 1;
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"Feature not writable: ",&local_2f9);
      std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
      std::invalid_argument::invalid_argument(piVar8,local_2d8);
      local_2fa = 0;
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool setIPV4Address(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IInteger *val=dynamic_cast<GenApi::IInteger *>(node);

        if (val != 0)
        {
          int64_t ip=0;

          std::stringstream in(value);
          std::string elem;

          for (int i=0; i<4; i++)
          {
            getline(in, elem, '.');
            ip=(ip<<8)|(stoi(elem)&0xff);
          }

          val->SetValue(ip);
          ret=true;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not integer: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}